

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  wasm_extern_vec_t exports;
  wasm_byte_vec_t binary;
  wasm_val_t results [4];
  wasm_extern_t *imports [1];
  wasm_valtype_vec_t tuple2;
  wasm_valtype_vec_t tuple1;
  wasm_valtype_t *types [4];
  wasm_val_t args [4];
  
  puts("Initializing...");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  puts("Loading binary...");
  __stream = fopen("multi.wasm","r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar3 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&binary,sVar3);
    sVar3 = fread(binary.data,sVar3,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar4 = wasm_module_new(uVar2,&binary);
      if (lVar4 == 0) {
        pcVar10 = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(&binary);
        puts("Creating callback...");
        types[0] = wasm_valtype_new_i32();
        types[1] = wasm_valtype_new_i64();
        types[2] = wasm_valtype_new_i64();
        types[3] = wasm_valtype_new_i32();
        wasm_valtype_vec_new(&tuple1,4,types);
        wasm_valtype_vec_copy(&tuple2,&tuple1);
        uVar5 = wasm_functype_new(&tuple1,&tuple2);
        uVar6 = wasm_func_new(uVar2,uVar5,callback);
        wasm_functype_delete(uVar5);
        puts("Instantiating module...");
        imports[0] = (wasm_extern_t *)wasm_func_as_extern(uVar6);
        lVar7 = wasm_instance_new(uVar2,lVar4,imports,0);
        if (lVar7 == 0) {
          pcVar10 = "> Error instantiating module!";
        }
        else {
          wasm_func_delete(uVar6);
          puts("Extracting export...");
          wasm_instance_exports(lVar7,&exports);
          if (exports.size == 0) {
            pcVar10 = "> Error accessing exports!";
          }
          else {
            lVar8 = wasm_extern_as_func(*exports.data);
            if (lVar8 != 0) {
              wasm_module_delete(lVar4);
              wasm_instance_delete(lVar7);
              puts("Calling export...");
              args[0].kind = '\0';
              args[0].of.i32 = 1;
              args[1].kind = '\x01';
              args[1].of.i64 = 2;
              args[2].kind = '\x01';
              args[2].of.i64 = 3;
              args[3].kind = '\0';
              args[3].of.i32 = 4;
              lVar4 = wasm_func_call(lVar8,args,results);
              if (lVar4 == 0) {
                wasm_extern_vec_delete(&exports);
                puts("Printing result...");
                printf("> %u %lu %lu %u\n",(ulong)(uint)results[0].of._0_4_,results[1].of.i64,
                       results[2].of.i64,(ulong)(uint)results[3].of._0_4_);
                if (results[0].of.i32 != 4) {
                  __assert_fail("results[0].of.i32 == 4",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/third_party/wasm-c-api/example/multi.c"
                                ,0x90,"int main(int, const char **)");
                }
                if (results[1].of.i64 != 3) {
                  __assert_fail("results[1].of.i64 == 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/third_party/wasm-c-api/example/multi.c"
                                ,0x91,"int main(int, const char **)");
                }
                if (results[2].of.i64 != 2) {
                  __assert_fail("results[2].of.i64 == 2",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/third_party/wasm-c-api/example/multi.c"
                                ,0x92,"int main(int, const char **)");
                }
                if (results[3].of.i32 != 1) {
                  __assert_fail("results[3].of.i32 == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/third_party/wasm-c-api/example/multi.c"
                                ,0x93,"int main(int, const char **)");
                }
                puts("Shutting down...");
                wasm_store_delete(uVar2);
                wasm_engine_delete(uVar1);
                iVar9 = 0;
                pcVar10 = "Done.";
              }
              else {
                iVar9 = 1;
                pcVar10 = "> Error calling function!";
              }
              puts(pcVar10);
              return iVar9;
            }
            pcVar10 = "> Error accessing export!";
          }
        }
      }
      goto LAB_0010164e;
    }
  }
  pcVar10 = "> Error loading module!";
LAB_0010164e:
  puts(pcVar10);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("multi.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  wasm_valtype_t* types[4] = {
    wasm_valtype_new_i32(), wasm_valtype_new_i64(),
    wasm_valtype_new_i64(), wasm_valtype_new_i32()
  };
  own wasm_valtype_vec_t tuple1, tuple2;
  wasm_valtype_vec_new(&tuple1, 4, types);
  wasm_valtype_vec_copy(&tuple2, &tuple1);
  own wasm_functype_t* callback_type = wasm_functype_new(&tuple1, &tuple2);
  own wasm_func_t* callback_func =
    wasm_func_new(store, callback_type, callback);

  wasm_functype_delete(callback_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = {wasm_func_as_extern(callback_func)};
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(callback_func);

  // Extract export.
  printf("Extracting export...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size == 0) {
    printf("> Error accessing exports!\n");
    return 1;
  }
  const wasm_func_t* run_func = wasm_extern_as_func(exports.data[0]);
  if (run_func == NULL) {
    printf("> Error accessing export!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  printf("Calling export...\n");
  wasm_val_t args[4];
  args[0].kind = WASM_I32;
  args[0].of.i32 = 1;
  args[1].kind = WASM_I64;
  args[1].of.i64 = 2;
  args[2].kind = WASM_I64;
  args[2].of.i64 = 3;
  args[3].kind = WASM_I32;
  args[3].of.i32 = 4;
  wasm_val_t results[4];
  if (wasm_func_call(run_func, args, results)) {
    printf("> Error calling function!\n");
    return 1;
  }

  wasm_extern_vec_delete(&exports);

  // Print result.
  printf("Printing result...\n");
  printf("> %"PRIu32" %"PRIu64" %"PRIu64" %"PRIu32"\n",
    results[0].of.i32, results[1].of.i64,
    results[2].of.i64, results[3].of.i32);

  assert(results[0].of.i32 == 4);
  assert(results[1].of.i64 == 3);
  assert(results[2].of.i64 == 2);
  assert(results[3].of.i32 == 1);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}